

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_io.cc
# Opt level: O3

void __thiscall
gimage::RAWImageIO::load
          (RAWImageIO *this,ImageU16 *image,char *name,int ds,long x,long y,long w,long h)

{
  int *piVar1;
  unsigned_short ***pppuVar2;
  size_t __n;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  void *__s;
  void *__s_00;
  IOException *this_00;
  long *plVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *pIVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  undefined7 uStack_338;
  bool msbfirst;
  ImageU16 *local_330;
  long local_328;
  long local_320;
  long width;
  allocator local_309;
  ulong local_308;
  long height;
  long local_2f8;
  long local_2f0;
  int type;
  size_t local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  ulong local_2a0;
  string filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ifstream in;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_228;
  uchar **ppuStack_218;
  uchar **local_210;
  uchar ***pppuStack_208;
  
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  filename._M_string_length = 0;
  filename.field_2._M_local_buf[0] = '\0';
  local_330 = image;
  local_328 = x;
  iVar6 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,1);
  if ((char)iVar6 == '\0') {
    this_00 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&local_278,name,&local_309);
    std::operator+(&local_258,"Can only load RAW image (",&local_278);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_258);
    _in = (pointer)*plVar9;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_in == paVar10) {
      aStack_228._M_allocated_capacity = paVar10->_M_allocated_capacity;
      aStack_228._8_8_ = plVar9[3];
      _in = (pointer)&aStack_228;
    }
    else {
      aStack_228._M_allocated_capacity = paVar10->_M_allocated_capacity;
    }
    *plVar9 = (long)paVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    gutil::IOException::IOException(this_00,(string *)&in);
    __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  (anonymous_namespace)::readRAWHeader_abi_cxx11_
            ((string *)&in,(_anonymous_namespace_ *)name,(char *)&type,(int *)&msbfirst,
             (bool *)&width,&height,(long *)CONCAT17(msbfirst,uStack_338));
  std::__cxx11::string::operator=((string *)&filename,(string *)&in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_in != &aStack_228) {
    operator_delete(_in);
  }
  if (type < 2) {
    _in = _in & 0xffffffff00000000;
    aStack_228._M_allocated_capacity = 0;
    aStack_228._8_8_ = 0;
    ppuStack_218 = (uchar **)0x0;
    local_210 = (uchar **)0x0;
    pppuStack_208 = (uchar ***)0x0;
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
              ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&in,0,0,1);
    (*(this->super_BasicImageIO)._vptr_BasicImageIO[6])
              (this,&in,name,(ulong)(uint)ds,local_328,y,w,h);
    Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setImageLimited<unsigned_char>
              (local_330,(Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&in);
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image
              ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)&in);
  }
  else {
    uVar7 = 1;
    if (1 < ds) {
      uVar7 = ds;
    }
    if (w < 0) {
      w = (long)(width + (ulong)uVar7 + -1) / (long)(ulong)uVar7;
    }
    if (h < 0) {
      h = (long)(height + (ulong)uVar7 + -1) / (long)(ulong)uVar7;
    }
    local_2f0 = h;
    Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::setSize(local_330,w,h,1);
    lVar14 = local_330->n;
    lVar12 = -lVar14;
    if (0 < lVar14) {
      lVar12 = lVar14;
    }
    memset(local_330->pixel,0,lVar12 * 2);
    std::ifstream::ifstream(&in);
    lVar14 = *(long *)(_in + -0x18);
    *(undefined4 *)((long)&aStack_228 + lVar14 + 0xc) = 7;
    std::ios::clear((int)&uStack_338 + (int)lVar14 + 0x100);
    std::ifstream::open((char *)&in,(_Ios_Openmode)filename._M_dataplus._M_p);
    if ((((ds < 2) && (y == 0 && local_328 == 0)) && (w == width)) && (local_2f0 == height)) {
      if (0 < local_2f0) {
        lVar12 = 0;
        pIVar11 = local_330;
        lVar14 = local_2f0;
        do {
          if (0 < w) {
            lVar16 = 0;
            do {
              if (msbfirst == true) {
                if (ppuStack_218 < local_210) {
                  uVar4 = (ushort)*(byte *)ppuStack_218;
                  ppuStack_218 = (uchar **)((long)ppuStack_218 + 1);
                }
                else {
                  uVar4 = (**(code **)(aStack_228._M_allocated_capacity + 0x50))(&aStack_228);
                  pIVar11 = local_330;
                }
                if (ppuStack_218 < local_210) {
                  bVar3 = *(byte *)ppuStack_218;
                  ppuStack_218 = (uchar **)((long)ppuStack_218 + 1);
                }
                else {
                  bVar3 = (**(code **)(aStack_228._M_allocated_capacity + 0x50))(&aStack_228);
                  pIVar11 = local_330;
                }
                uVar4 = (ushort)bVar3 | uVar4 << 8;
              }
              else {
                if (ppuStack_218 < local_210) {
                  uVar4 = (ushort)*(byte *)ppuStack_218;
                  ppuStack_218 = (uchar **)((long)ppuStack_218 + 1);
                }
                else {
                  uVar4 = (**(code **)(aStack_228._M_allocated_capacity + 0x50))(&aStack_228);
                  pIVar11 = local_330;
                }
                if (ppuStack_218 < local_210) {
                  uVar5 = (ushort)*(byte *)ppuStack_218;
                  ppuStack_218 = (uchar **)((long)ppuStack_218 + 1);
                }
                else {
                  uVar5 = (**(code **)(aStack_228._M_allocated_capacity + 0x50))(&aStack_228);
                  pIVar11 = local_330;
                }
                uVar4 = uVar5 << 8 | uVar4 & 0xff;
              }
              (*pIVar11->img)[lVar12][lVar16] = uVar4;
              lVar16 = lVar16 + 1;
              lVar14 = height;
              w = width;
            } while (lVar16 < width);
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < lVar14);
      }
    }
    else {
      uVar15 = w * 4;
      __s = operator_new(uVar15);
      if (w != 0) {
        memset(__s,0,uVar15);
      }
      local_2e0 = uVar15;
      __s_00 = operator_new(uVar15);
      if (w != 0) {
        memset(__s_00,0,local_2e0);
      }
      lVar14 = 0;
      if (-y != 0 && y < 1) {
        lVar14 = -y;
      }
      if (lVar14 < local_2f0) {
        uVar15 = (ulong)uVar7;
        local_2b0 = 0;
        if (0 < local_328) {
          local_2b0 = local_328;
        }
        local_2b0 = local_2b0 * uVar15;
        local_2f8 = -local_328;
        if (-local_328 == 0 || 0 < local_328) {
          local_2f8 = 0;
        }
        local_2b8 = (local_328 + local_2f8) * uVar15;
        local_2d0 = (local_328 + local_2f8 + -1) * uVar15;
        local_308 = uVar15;
        local_2d8 = w;
        local_2c8 = y;
        do {
          __n = local_2e0;
          local_2a8 = (lVar14 + local_2c8) * uVar15;
          if (height <= local_2a8) break;
          local_2c0 = lVar14;
          if (w != 0) {
            memset(__s,0,local_2e0);
            memset(__s_00,0,__n);
            uVar15 = local_308;
          }
          uVar13 = 0;
          do {
            if (height <= (long)(uVar13 + local_2a8)) break;
            local_2a0 = uVar13;
            std::istream::seekg(&in,((uVar13 + local_2a8) * width + local_2b0) * 2,0);
            lVar14 = local_328;
            lVar12 = local_2b8;
            uVar15 = local_308;
            uVar13 = local_308;
            lVar16 = local_2f8;
            if (local_2f8 < w) {
              do {
                uVar15 = uVar13;
                lVar17 = lVar12;
                if (width <= (long)((lVar16 + lVar14) * uVar13)) break;
                do {
                  if (width <= lVar17) break;
                  if (msbfirst == true) {
                    if (ppuStack_218 < local_210) {
                      uVar7 = (uint)*(byte *)ppuStack_218;
                      ppuStack_218 = (uchar **)((long)ppuStack_218 + 1);
                    }
                    else {
                      local_320 = lVar12;
                      uVar7 = (**(code **)(aStack_228._M_allocated_capacity + 0x50))(&aStack_228);
                      lVar14 = local_328;
                      lVar12 = local_320;
                      uVar15 = local_308;
                    }
                    if (ppuStack_218 < local_210) {
                      bVar3 = *(byte *)ppuStack_218;
                      ppuStack_218 = (uchar **)((long)ppuStack_218 + 1);
                    }
                    else {
                      local_320 = lVar12;
                      bVar3 = (**(code **)(aStack_228._M_allocated_capacity + 0x50))(&aStack_228);
                      lVar14 = local_328;
                      lVar12 = local_320;
                      uVar15 = local_308;
                    }
                    uVar7 = (uint)bVar3 | uVar7 << 8;
                  }
                  else {
                    if (ppuStack_218 < local_210) {
                      uVar7 = (uint)*(byte *)ppuStack_218;
                      ppuStack_218 = (uchar **)((long)ppuStack_218 + 1);
                    }
                    else {
                      local_320 = lVar12;
                      uVar7 = (**(code **)(aStack_228._M_allocated_capacity + 0x50))(&aStack_228);
                      lVar14 = local_328;
                      lVar12 = local_320;
                      uVar15 = local_308;
                    }
                    if (ppuStack_218 < local_210) {
                      uVar8 = (uint)*(byte *)ppuStack_218;
                      ppuStack_218 = (uchar **)((long)ppuStack_218 + 1);
                    }
                    else {
                      local_320 = lVar12;
                      uVar8 = (**(code **)(aStack_228._M_allocated_capacity + 0x50))(&aStack_228);
                      lVar14 = local_328;
                      lVar12 = local_320;
                      uVar15 = local_308;
                    }
                    uVar7 = uVar8 << 8 | uVar7 & 0xff;
                  }
                  piVar1 = (int *)((long)__s + lVar16 * 4);
                  *piVar1 = *piVar1 + (uVar7 & 0xffff);
                  piVar1 = (int *)((long)__s_00 + lVar16 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar17 = lVar17 + 1;
                  uVar13 = uVar13 - 1;
                } while (uVar13 != 0);
                lVar16 = lVar16 + 1;
                lVar12 = lVar12 + uVar15;
                uVar13 = uVar15;
              } while (lVar16 != local_2d8);
            }
            uVar13 = local_2a0 + 1;
            w = local_2d8;
          } while (uVar13 != uVar15);
          if (local_2f8 < w) {
            pppuVar2 = local_330->img;
            lVar14 = local_2d0;
            lVar12 = local_2f8;
            do {
              lVar14 = lVar14 + uVar15;
              if (width <= lVar14) break;
              iVar6 = *(int *)((long)__s_00 + lVar12 * 4);
              if (0 < iVar6) {
                (*pppuVar2)[local_2c0][lVar12] =
                     (ushort)(*(int *)((long)__s + lVar12 * 4) / iVar6) & 0xff;
              }
              lVar12 = lVar12 + 1;
            } while (w != lVar12);
          }
          lVar14 = local_2c0 + 1;
        } while (lVar14 != local_2f0);
      }
      operator_delete(__s_00);
      operator_delete(__s);
    }
    std::ifstream::close();
    std::ifstream::~ifstream(&in);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != &filename.field_2) {
    operator_delete(filename._M_dataplus._M_p);
  }
  return;
}

Assistant:

void RAWImageIO::load(ImageU16 &image, const char *name, int ds, long x, long y,
                      long w, long h) const
{
  std::string filename;
  long   width, height;
  int    type;
  bool   msbfirst;

  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load RAW image ("+std::string(name)+")");
  }

  filename=readRAWHeader(name, type, msbfirst, width, height);

  if (type > 1)
  {
    ds=std::max(1, ds);

    if (w < 0)
    {
      w=(width+ds-1)/ds;
    }

    if (h < 0)
    {
      h=(height+ds-1)/ds;
    }

    image.setSize(w, h, 1);
    image.clear();

    try
    {
      std::ifstream in;
      in.exceptions(std::ios_base::failbit | std::ios_base::badbit | std::ios_base::eofbit);
      in.open(filename.c_str(), std::ios::binary);

      // load downscaled part?

      if (ds > 1 || x != 0 || y != 0 || w != width || h != height)
      {
        std::valarray<ImageU8::work_t> vline(0, w);
        std::valarray<int> nline(0, w);

        for (long k=std::max(0l, -y); k<h && (y+k)*ds<height; k++)
        {
          // load downscaled line

          vline=0;
          nline=0;

          for (long kk=0; kk<ds && kk+(y+k)*ds<height; kk++)
          {
            in.seekg(static_cast<std::streamoff>((y+k)*ds+kk)*width*2+
                     static_cast<std::streamoff>(std::max(0l, x))*ds*2);

            std::streambuf *sb=in.rdbuf();

            long j=std::max(0l, -x);

            for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
            {
              for (int ii=0; ii<ds && (x+i)*ds+ii<width; ii++)
              {
                ImageU16::store_t v;

                if (msbfirst)
                {
                  v=(static_cast<ImageU16::store_t>(sb->sbumpc())&0xff);
                  v=(v<<8)|(static_cast<ImageU16::store_t>(sb->sbumpc())&0xff);
                }
                else
                {
                  v=(static_cast<ImageU16::store_t>(sb->sbumpc())&0xff);
                  v=v|((static_cast<ImageU16::store_t>(sb->sbumpc())&0xff)<<8);
                }

                if (image.isValidS(v))
                {
                  vline[j]+=v;
                  nline[j]++;
                }
              }

              j++;
            }
          }

          // store line into image

          long j=std::max(0l, -x);

          for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
          {
            if (nline[j] > 0)
            {
              image.set(i, k, 0, static_cast<ImageU8::store_t>(vline[j]/nline[j]));
            }

            j++;
          }
        }
      }
      else // load whole image
      {
        std::streambuf *sb=in.rdbuf();

        for (long k=0; k<height; k++)
        {
          for (long i=0; i<width; i++)
          {
            ImageU16::store_t v;

            if (msbfirst)
            {
              v=(static_cast<ImageU16::store_t>(sb->sbumpc())&0xff);
              v=(v<<8)|(static_cast<ImageU16::store_t>(sb->sbumpc())&0xff);
            }
            else
            {
              v=(static_cast<ImageU16::store_t>(sb->sbumpc())&0xff);
              v=v|((static_cast<ImageU16::store_t>(sb->sbumpc())&0xff)<<8);
            }

            image.set(i, k, 0, v);
          }
        }
      }

      in.close();
    }
    catch (const std::ios_base::failure &ex)
    {
      throw gutil::IOException(ex.what());
    }
  }
  else
  {
    ImageU8 imageu8;
    load(imageu8, name, ds, x, y, w, h);
    image.setImageLimited(imageu8);
  }
}